

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OctreeTracer.cpp
# Opt level: O3

void __thiscall
OctreeTracer::create_beam_graphics_pipeline(OctreeTracer *this,shared_ptr<myvk::Device> *device)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  ShaderModule *this_01;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 this_02;
  undefined8 this_03;
  initializer_list<VkPipelineShaderStageCreateInfo> __l;
  initializer_list<VkDynamicState> __l_00;
  vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
  shader_stages;
  uint32_t kOctreeTracerBeamFragSpv [2774];
  allocator_type local_2e59;
  undefined1 local_2e58 [40];
  VkPipeline local_2e30;
  element_type *local_2e28;
  undefined1 local_2e20 [24];
  element_type *local_2e08;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_2e00;
  VkSpecializationInfo *local_2df8;
  undefined1 auStack_2df0 [16];
  VertexInputState local_2de0;
  InputAssemblyState local_2d78;
  VkStructureType local_2d50;
  void *local_2d48;
  undefined8 uStack_2d40;
  bool local_2d38;
  ViewportState local_2d30;
  MultisampleState local_2cc8;
  VkStructureType local_2c90;
  void *local_2c88;
  undefined8 uStack_2c80;
  undefined8 local_2c78;
  undefined8 uStack_2c70;
  undefined1 local_2c68 [32];
  undefined8 local_2c48;
  undefined8 uStack_2c40;
  undefined8 local_2c38;
  undefined8 uStack_2c30;
  bool local_2c28;
  ColorBlendState local_2c20;
  DynamicState local_2bc8;
  uint32_t local_2b88 [2776];
  
  memcpy(local_2b88,&DAT_00239c40,0x2b58);
  myvk::ShaderModule::Create((ShaderModule *)local_2e20,device,kQuadVertSpv,0x354);
  this_02 = local_2e20._8_8_;
  this_01 = (ShaderModule *)CONCAT44(local_2e20._4_4_,local_2e20._0_4_);
  myvk::ShaderModule::Create((ShaderModule *)local_2e20,device,local_2b88,0x2b58);
  this_03 = local_2e20._8_8_;
  myvk::ShaderModule::GetPipelineShaderStageCreateInfo
            ((VkPipelineShaderStageCreateInfo *)local_2e20,this_01,VK_SHADER_STAGE_VERTEX_BIT,
             (VkSpecializationInfo *)0x0);
  myvk::ShaderModule::GetPipelineShaderStageCreateInfo
            ((VkPipelineShaderStageCreateInfo *)auStack_2df0,
             (ShaderModule *)CONCAT44(local_2e20._4_4_,local_2e20._0_4_),
             VK_SHADER_STAGE_FRAGMENT_BIT,(VkSpecializationInfo *)0x0);
  __l._M_len = 2;
  __l._M_array = (iterator)local_2e20;
  std::vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>::
  vector((vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
          *)(local_2e58 + 0x18),__l,(allocator_type *)local_2e58);
  local_2e20._0_4_ = VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_CREATE_INFO;
  local_2e20._8_8_ = (element_type *)0x0;
  local_2e20._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_2e08 = (element_type *)0x0;
  _Stack_2e00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_2df8 = (VkSpecializationInfo *)0x0;
  auStack_2df0._0_8_ = 0;
  auStack_2df0._8_4_ = 0.0;
  local_2de0.m_bindings.
  super__Vector_base<VkVertexInputBindingDescription,_std::allocator<VkVertexInputBindingDescription>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2de0.m_bindings.
  super__Vector_base<VkVertexInputBindingDescription,_std::allocator<VkVertexInputBindingDescription>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2de0.m_bindings.
  super__Vector_base<VkVertexInputBindingDescription,_std::allocator<VkVertexInputBindingDescription>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2de0.m_attributes.
  super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2de0.m_attributes.
  super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2de0.m_attributes.
  super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2de0.m_create_info.sType = VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO;
  local_2de0.m_create_info.pVertexAttributeDescriptions = (VkVertexInputAttributeDescription *)0x0;
  local_2de0.m_enable = false;
  local_2de0.m_create_info.pNext = (void *)0x0;
  local_2de0.m_create_info.flags = 0;
  local_2de0.m_create_info.vertexBindingDescriptionCount = 0;
  local_2de0.m_create_info.pVertexBindingDescriptions._0_4_ = 0;
  local_2de0.m_create_info._28_8_ = 0;
  local_2d78.m_create_info.sType = VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO;
  local_2d78.m_enable = false;
  local_2d78.m_create_info.pNext = (void *)0x0;
  local_2d78.m_create_info.flags = 0;
  local_2d78.m_create_info.topology = VK_PRIMITIVE_TOPOLOGY_POINT_LIST;
  local_2d78.m_create_info.primitiveRestartEnable = 0;
  local_2d50 = VK_STRUCTURE_TYPE_PIPELINE_TESSELLATION_STATE_CREATE_INFO;
  local_2d38 = false;
  local_2d48 = (void *)0x0;
  uStack_2d40._0_4_ = 0;
  uStack_2d40._4_4_ = 0;
  local_2d30.m_scissors.super__Vector_base<VkRect2D,_std::allocator<VkRect2D>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2d30.m_scissors.super__Vector_base<VkRect2D,_std::allocator<VkRect2D>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2d30.m_viewports.super__Vector_base<VkViewport,_std::allocator<VkViewport>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2d30.m_scissors.super__Vector_base<VkRect2D,_std::allocator<VkRect2D>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2d30.m_viewports.super__Vector_base<VkViewport,_std::allocator<VkViewport>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2d30.m_viewports.super__Vector_base<VkViewport,_std::allocator<VkViewport>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2d30.m_create_info.sType = VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO;
  local_2d30.m_create_info.pScissors = (VkRect2D *)0x0;
  local_2d30.m_enable = false;
  local_2d30.m_create_info.pNext = (void *)0x0;
  local_2d30.m_create_info.flags = 0;
  local_2d30.m_create_info.viewportCount = 0;
  local_2d30.m_create_info.pViewports._0_4_ = 0;
  local_2d30.m_create_info._28_8_ = 0;
  local_2cc8.m_create_info.sType = VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO;
  local_2cc8.m_create_info.alphaToCoverageEnable._0_1_ = 0;
  local_2cc8._41_8_ = 0;
  local_2cc8.m_create_info.sampleShadingEnable = 0;
  local_2cc8.m_create_info.minSampleShading = 0.0;
  local_2cc8.m_create_info.pSampleMask._0_1_ = 0;
  local_2cc8.m_create_info.pSampleMask._1_7_ = 0;
  local_2cc8.m_create_info.pNext = (void *)0x0;
  local_2cc8.m_create_info.flags = 0;
  local_2cc8.m_create_info.rasterizationSamples = 0;
  local_2c90 = VK_STRUCTURE_TYPE_PIPELINE_DEPTH_STENCIL_STATE_CREATE_INFO;
  local_2c88 = (void *)0x0;
  uStack_2c80._0_4_ = 0;
  uStack_2c80._4_4_ = 0;
  local_2c78._0_4_ = 0;
  local_2c78._4_4_ = VK_COMPARE_OP_NEVER;
  uStack_2c70._0_4_ = 0;
  uStack_2c70._4_4_ = 0;
  local_2c68._0_4_ = VK_STENCIL_OP_KEEP;
  local_2c68._4_4_ = VK_STENCIL_OP_KEEP;
  local_2c68._8_4_ = VK_STENCIL_OP_KEEP;
  local_2c68._12_4_ = VK_COMPARE_OP_NEVER;
  local_2c68._16_4_ = 0;
  local_2c68._20_4_ = 0;
  local_2c68._24_4_ = 0;
  local_2c68._28_4_ = VK_STENCIL_OP_KEEP;
  local_2c48._0_4_ = VK_STENCIL_OP_KEEP;
  local_2c48._4_4_ = VK_STENCIL_OP_KEEP;
  uStack_2c40._0_4_ = VK_COMPARE_OP_NEVER;
  uStack_2c40._4_4_ = 0;
  local_2c38._0_4_ = 0;
  local_2c38._4_4_ = 0;
  uStack_2c30._0_4_ = 0.0;
  uStack_2c30._4_4_ = 0.0;
  local_2c28 = false;
  local_2c20.m_color_blend_attachments.
  super__Vector_base<VkPipelineColorBlendAttachmentState,_std::allocator<VkPipelineColorBlendAttachmentState>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2c20.m_color_blend_attachments.
  super__Vector_base<VkPipelineColorBlendAttachmentState,_std::allocator<VkPipelineColorBlendAttachmentState>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2c20.m_color_blend_attachments.
  super__Vector_base<VkPipelineColorBlendAttachmentState,_std::allocator<VkPipelineColorBlendAttachmentState>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2c20.m_create_info.sType = VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_STATE_CREATE_INFO;
  local_2c20.m_enable = false;
  local_2c20.m_create_info.blendConstants[0] = 0.0;
  local_2c20.m_create_info.blendConstants[1] = 0.0;
  local_2c20.m_create_info.blendConstants[2] = 0.0;
  local_2c20.m_create_info.blendConstants[3] = 0.0;
  local_2c20.m_create_info.logicOp = VK_LOGIC_OP_CLEAR;
  local_2c20.m_create_info.attachmentCount = 0;
  local_2c20.m_create_info.pAttachments = (VkPipelineColorBlendAttachmentState *)0x0;
  local_2c20.m_create_info.pNext = (void *)0x0;
  local_2c20.m_create_info.flags = 0;
  local_2c20.m_create_info.logicOpEnable = 0;
  local_2bc8.m_dynamic_states.super__Vector_base<VkDynamicState,_std::allocator<VkDynamicState>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2bc8.m_dynamic_states.super__Vector_base<VkDynamicState,_std::allocator<VkDynamicState>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2bc8.m_dynamic_states.super__Vector_base<VkDynamicState,_std::allocator<VkDynamicState>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2bc8.m_create_info.sType = VK_STRUCTURE_TYPE_PIPELINE_DYNAMIC_STATE_CREATE_INFO;
  local_2bc8.m_create_info.pDynamicStates._0_1_ = 0;
  local_2bc8._49_8_ = 0;
  local_2bc8.m_create_info.pNext = (void *)0x0;
  local_2bc8.m_create_info.flags._0_1_ = 0;
  local_2bc8.m_create_info._17_7_ = 0;
  myvk::GraphicsPipelineState::VertexInputState::Enable(&local_2de0);
  myvk::GraphicsPipelineState::InputAssemblyState::Enable
            (&local_2d78,VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST,0);
  myvk::GraphicsPipelineState::ViewportState::Enable(&local_2d30,1,1);
  myvk::GraphicsPipelineState::RasterizationState::Initialize
            ((RasterizationState *)local_2e20,VK_POLYGON_MODE_FILL,VK_FRONT_FACE_COUNTER_CLOCKWISE,1
            );
  myvk::GraphicsPipelineState::MultisampleState::Enable(&local_2cc8,VK_SAMPLE_COUNT_1_BIT);
  myvk::GraphicsPipelineState::ColorBlendState::Enable(&local_2c20,1,0);
  local_2e28 = (element_type *)0x100000000;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&local_2e28;
  std::vector<VkDynamicState,_std::allocator<VkDynamicState>_>::vector
            ((vector<VkDynamicState,_std::allocator<VkDynamicState>_> *)local_2e58,__l_00,
             &local_2e59);
  myvk::GraphicsPipelineState::DynamicState::Enable
            (&local_2bc8,(vector<VkDynamicState,_std::allocator<VkDynamicState>_> *)local_2e58);
  if ((element_type *)local_2e58._0_8_ != (element_type *)0x0) {
    operator_delete((void *)local_2e58._0_8_,local_2e58._16_8_ - local_2e58._0_8_);
  }
  myvk::GraphicsPipeline::Create
            ((GraphicsPipeline *)local_2e58,&this->m_beam_pipeline_layout,&this->m_beam_render_pass,
             (vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
              *)(local_2e58 + 0x18),(GraphicsPipelineState *)local_2e20,0);
  uVar2 = local_2e58._8_8_;
  uVar1 = local_2e58._0_8_;
  local_2e58._0_8_ = (_func_int **)0x0;
  local_2e58._8_8_ = (element_type *)0x0;
  this_00 = (this->m_beam_graphics_pipeline).
            super___shared_ptr<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  (this->m_beam_graphics_pipeline).
  super___shared_ptr<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)uVar1;
  (this->m_beam_graphics_pipeline).
  super___shared_ptr<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    if ((element_type *)local_2e58._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e58._8_8_);
    }
  }
  if (local_2bc8.m_dynamic_states.
      super__Vector_base<VkDynamicState,_std::allocator<VkDynamicState>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2bc8.m_dynamic_states.
                    super__Vector_base<VkDynamicState,_std::allocator<VkDynamicState>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2bc8.m_dynamic_states.
                          super__Vector_base<VkDynamicState,_std::allocator<VkDynamicState>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2bc8.m_dynamic_states.
                          super__Vector_base<VkDynamicState,_std::allocator<VkDynamicState>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2c20.m_color_blend_attachments.
      super__Vector_base<VkPipelineColorBlendAttachmentState,_std::allocator<VkPipelineColorBlendAttachmentState>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2c20.m_color_blend_attachments.
                    super__Vector_base<VkPipelineColorBlendAttachmentState,_std::allocator<VkPipelineColorBlendAttachmentState>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2c20.m_color_blend_attachments.
                          super__Vector_base<VkPipelineColorBlendAttachmentState,_std::allocator<VkPipelineColorBlendAttachmentState>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2c20.m_color_blend_attachments.
                          super__Vector_base<VkPipelineColorBlendAttachmentState,_std::allocator<VkPipelineColorBlendAttachmentState>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2d30.m_scissors.super__Vector_base<VkRect2D,_std::allocator<VkRect2D>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2d30.m_scissors.super__Vector_base<VkRect2D,_std::allocator<VkRect2D>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_2d30.m_scissors.
                          super__Vector_base<VkRect2D,_std::allocator<VkRect2D>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2d30.m_scissors.
                          super__Vector_base<VkRect2D,_std::allocator<VkRect2D>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_2d30.m_viewports.super__Vector_base<VkViewport,_std::allocator<VkViewport>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2d30.m_viewports.
                    super__Vector_base<VkViewport,_std::allocator<VkViewport>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2d30.m_viewports.
                          super__Vector_base<VkViewport,_std::allocator<VkViewport>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2d30.m_viewports.
                          super__Vector_base<VkViewport,_std::allocator<VkViewport>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((VkSpecializationInfo *)
      local_2de0.m_attributes.
      super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
      ._M_impl.super__Vector_impl_data._M_start != (VkSpecializationInfo *)0x0) {
    operator_delete(local_2de0.m_attributes.
                    super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2de0.m_attributes.
                          super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2de0.m_attributes.
                          super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2de0.m_bindings.
      super__Vector_base<VkVertexInputBindingDescription,_std::allocator<VkVertexInputBindingDescription>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2de0.m_bindings.
                    super__Vector_base<VkVertexInputBindingDescription,_std::allocator<VkVertexInputBindingDescription>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2de0.m_bindings.
                          super__Vector_base<VkVertexInputBindingDescription,_std::allocator<VkVertexInputBindingDescription>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2de0.m_bindings.
                          super__Vector_base<VkVertexInputBindingDescription,_std::allocator<VkVertexInputBindingDescription>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((element_type *)local_2e58._24_8_ != (element_type *)0x0) {
    operator_delete((void *)local_2e58._24_8_,(long)local_2e30 - local_2e58._24_8_);
  }
  if ((element_type *)this_03 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_03);
  }
  if ((element_type *)this_02 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_02);
  }
  return;
}

Assistant:

void OctreeTracer::create_beam_graphics_pipeline(const std::shared_ptr<myvk::Device> &device) {
	constexpr uint32_t kOctreeTracerBeamFragSpv[] = {
#include "spirv/octree_tracer_beam.frag.u32"
	};
	std::shared_ptr<myvk::ShaderModule> vert_shader_module, frag_shader_module;
	vert_shader_module = myvk::ShaderModule::Create(device, kQuadVertSpv, sizeof(kQuadVertSpv));
	frag_shader_module = myvk::ShaderModule::Create(device, kOctreeTracerBeamFragSpv, sizeof(kOctreeTracerBeamFragSpv));

	std::vector<VkPipelineShaderStageCreateInfo> shader_stages = {
	    vert_shader_module->GetPipelineShaderStageCreateInfo(VK_SHADER_STAGE_VERTEX_BIT),
	    frag_shader_module->GetPipelineShaderStageCreateInfo(VK_SHADER_STAGE_FRAGMENT_BIT)};

	myvk::GraphicsPipelineState pipeline_state = {};
	pipeline_state.m_vertex_input_state.Enable();
	pipeline_state.m_input_assembly_state.Enable(VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST);
	pipeline_state.m_viewport_state.Enable(1, 1);
	pipeline_state.m_rasterization_state.Initialize(VK_POLYGON_MODE_FILL, VK_FRONT_FACE_COUNTER_CLOCKWISE,
	                                                VK_CULL_MODE_FRONT_BIT);
	pipeline_state.m_multisample_state.Enable(VK_SAMPLE_COUNT_1_BIT);
	pipeline_state.m_color_blend_state.Enable(1, VK_FALSE);
	pipeline_state.m_dynamic_state.Enable({VK_DYNAMIC_STATE_VIEWPORT, VK_DYNAMIC_STATE_SCISSOR});

	m_beam_graphics_pipeline =
	    myvk::GraphicsPipeline::Create(m_beam_pipeline_layout, m_beam_render_pass, shader_stages, pipeline_state, 0);
}